

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::print(ANN *this,LayerType type)

{
  uint index;
  
  index = 0;
  if (type == OutputLayer) {
    index = (int)(((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x58) - 1;
  }
  print(this,index);
  return;
}

Assistant:

void ANN::print(LayerType type) const{
    uint index;
    switch (type)
    {
    case InputLayer:
        index=0;
        break;
    case OutputLayer:
        index=m_layers.size()-1;
        break;
    default: break;
    }
    print(index);
}